

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

shared_ptr<kratos::IfStmt> kratos::create_if_stmt_wrapper(StmtBlock *block,Port *port,bool clone)

{
  _Hash_node_base *p_Var1;
  shared_ptr<kratos::Stmt> *psVar2;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Hash_node_base *p_Var3;
  shared_ptr<kratos::Stmt> *stmt;
  undefined1 stmt_00 [8];
  shared_ptr<kratos::IfStmt> sVar4;
  shared_ptr<kratos::Stmt> local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_50;
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  
  (block->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)0x0;
  local_50 = &(block->super_Stmt).super_IRNode.fn_name_ln;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_50,(IfStmt **)block,
             (allocator<kratos::IfStmt> *)auStack_48,(Port *)CONCAT71(in_register_00000011,clone));
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)block,
             (IfStmt *)(block->super_Stmt).super_IRNode._vptr_IRNode);
  stmts.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  stmts.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p_Var3 = (_Hash_node_base *)(port->super_Var).size_param_._M_h._M_bucket_count;
  p_Var1 = (port->super_Var).size_param_._M_h._M_before_begin._M_nxt;
  stmt_00 = auStack_48;
  psVar2 = stmts.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var3 != p_Var1) {
    do {
      (*(code *)p_Var3->_M_nxt->_M_nxt[0xb]._M_nxt)(&local_60);
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>const>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)auStack_48,&local_60);
      if (local_60.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      p_Var3 = p_Var3 + 2;
      stmt_00 = auStack_48;
      psVar2 = stmts.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (p_Var3 != p_Var1);
  }
  for (; stmt_00 != (undefined1  [8])psVar2; stmt_00 = (undefined1  [8])((long)stmt_00 + 0x10)) {
    IfStmt::add_then_stmt
              ((IfStmt *)(block->super_Stmt).super_IRNode._vptr_IRNode,
               (shared_ptr<kratos::Stmt> *)stmt_00);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_48);
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)block;
  return (shared_ptr<kratos::IfStmt>)
         sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<IfStmt> create_if_stmt_wrapper(StmtBlock* block, Port& port,
                                                      bool clone = false) {
    auto if_ = std::make_shared<IfStmt>(port);
    std::vector<std::shared_ptr<Stmt>> stmts;
    for (auto const& stmt : *block) {
        stmts.emplace_back(clone ? stmt->clone() : stmt);
    }
    if (!clone) block->clear();
    for (auto& stmt : stmts) {
        if (!clone) stmt->remove_from_parent();
        if_->add_then_stmt(stmt);
    }
    return if_;
}